

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char8_t * fmt::v5::internal::
          parse_format_specs<fmt::v5::char8_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&>
                    (char8_t *begin,char8_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                    *handler)

{
  uint_least8_t *puVar1;
  char8_t cVar2;
  basic_format_specs<fmt::v5::char8_t> *pbVar3;
  bool bVar4;
  char8_t cVar5;
  type tVar6;
  ulong uVar7;
  alignment aVar8;
  uint uVar9;
  char8_t *pcVar10;
  char8_t *pcVar11;
  char8_t *local_38;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
  local_30;
  
  if (begin == end) {
    return begin;
  }
  cVar5 = *begin;
  if (cVar5 == 0x7d) {
    return begin;
  }
  pcVar10 = begin + 1;
  uVar7 = (ulong)(pcVar10 != end);
  do {
    cVar2 = begin[uVar7];
    if (0x3d < cVar2) {
      if (cVar2 == 0x5e) {
        aVar8 = ALIGN_CENTER;
      }
      else {
        if (cVar2 != 0x3e) goto LAB_0021069a;
        aVar8 = ALIGN_RIGHT;
      }
LAB_002106c4:
      bVar4 = false;
LAB_002106c6:
      if ((int)uVar7 != 0) {
        if (cVar5 == 0x7b) {
          error_handler::on_error
                    ((error_handler *)
                     (handler->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                     ).context_,"invalid fill character \'{\'");
          break;
        }
        pcVar10 = begin + 2;
        (((handler->
          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
          ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_align_spec).fill_ = (uint)cVar5;
      }
      if ((bVar4) && (8 < handler->arg_type_ - named_arg_type)) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"format specifier requires numeric argument");
      }
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
        ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_align_spec).align_ = aVar8;
      begin = pcVar10;
      break;
    }
    if (cVar2 == 0x3c) {
      aVar8 = ALIGN_LEFT;
      goto LAB_002106c4;
    }
    if (cVar2 == 0x3d) {
      aVar8 = ALIGN_NUMERIC;
      bVar4 = true;
      goto LAB_002106c6;
    }
LAB_0021069a:
    bVar4 = 0 < (long)uVar7;
    uVar7 = uVar7 - 1;
  } while (bVar4);
  if (begin == end) {
    return begin;
  }
  cVar5 = *begin;
  local_38 = begin;
  if (cVar5 == 0x20) {
    tVar6 = handler->arg_type_;
    uVar9 = tVar6 - named_arg_type;
    if (8 < uVar9) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"format specifier requires numeric argument");
      tVar6 = handler->arg_type_;
      uVar9 = tVar6 - named_arg_type;
    }
    if ((uVar9 < 7) && ((char_type < tVar6 || ((0x94U >> (tVar6 & 0x1f) & 1) == 0)))) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"format specifier requires signed argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 1;
LAB_00210828:
    begin = begin + 1;
  }
  else {
    if (cVar5 == 0x2d) {
      tVar6 = handler->arg_type_;
      uVar9 = tVar6 - named_arg_type;
      if (8 < uVar9) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"format specifier requires numeric argument");
        tVar6 = handler->arg_type_;
        uVar9 = tVar6 - named_arg_type;
      }
      if ((uVar9 < 7) && ((char_type < tVar6 || ((0x94U >> (tVar6 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                  ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 4;
      goto LAB_00210828;
    }
    if (cVar5 == 0x2b) {
      tVar6 = handler->arg_type_;
      uVar9 = tVar6 - named_arg_type;
      if (8 < uVar9) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"format specifier requires numeric argument");
        tVar6 = handler->arg_type_;
        uVar9 = tVar6 - named_arg_type;
      }
      if ((uVar9 < 7) && ((char_type < tVar6 || ((0x94U >> (tVar6 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                  ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 3;
      goto LAB_00210828;
    }
  }
  if (begin == end) {
    return begin;
  }
  cVar5 = *begin;
  local_38 = begin;
  if (cVar5 == 0x23) {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"format specifier requires numeric argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 8;
    local_38 = begin + 1;
    if (local_38 == end) {
      return local_38;
    }
    cVar5 = *local_38;
  }
  pcVar10 = local_38;
  if (cVar5 == 0x30) {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"format specifier requires numeric argument");
    }
    pbVar3 = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
             ).super_specs_setter<fmt::v5::char8_t>.specs_;
    (pbVar3->super_align_spec).fill_ = L'0';
    (pbVar3->super_align_spec).align_ = ALIGN_NUMERIC;
    local_38 = pcVar10 + 1;
    if (local_38 == end) {
      return local_38;
    }
    cVar5 = *local_38;
  }
  if ((byte)(cVar5 - 0x30) < 10) {
    pcVar10 = local_38 + 1;
    uVar9 = 0;
    pcVar11 = pcVar10;
    if (cVar5 != 0x30) {
      do {
        if (0xccccccc < uVar9) {
          pcVar10 = pcVar11 + -1;
          uVar9 = 0x80000000;
          goto LAB_00210958;
        }
        uVar9 = ((uint)cVar5 + uVar9 * 10) - 0x30;
        pcVar10 = end;
        if (pcVar11 == end) break;
        cVar5 = *pcVar11;
        pcVar10 = pcVar11;
        pcVar11 = pcVar11 + 1;
      } while ((byte)(cVar5 - 0x30) < 10);
      if ((int)uVar9 < 0) {
LAB_00210958:
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"number is too big");
      }
    }
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
      ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_align_spec).width_ = uVar9;
LAB_0021096e:
    local_38 = pcVar10;
    if (pcVar10 == end) {
      return pcVar10;
    }
  }
  else if (cVar5 == 0x7b) {
    pcVar10 = local_38 + 1;
    if (pcVar10 != end) {
      local_30.handler = handler;
      pcVar10 = parse_arg_id<fmt::v5::char8_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&,fmt::v5::char8_t>>
                          (pcVar10,end,&local_30);
    }
    if ((pcVar10 == end) || (*pcVar10 != 0x7d)) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"invalid format string");
    }
    else {
      pcVar10 = pcVar10 + 1;
    }
    goto LAB_0021096e;
  }
  if (*local_38 == 0x2e) {
    pcVar10 = local_38 + 1;
    if (pcVar10 == end) {
LAB_00210a51:
      local_38 = pcVar10;
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"missing precision specifier");
      return pcVar10;
    }
    if (*pcVar10 - 0x30 < 10) {
      local_38 = pcVar10;
      uVar9 = parse_nonnegative_int<fmt::v5::char8_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&>
                        (&local_38,end,handler);
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
        ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).precision = uVar9;
    }
    else {
      if (*pcVar10 != 0x7b) goto LAB_00210a51;
      pcVar10 = local_38 + 2;
      local_38 = pcVar10;
      if (pcVar10 != end) {
        local_30.handler = handler;
        pcVar10 = parse_arg_id<fmt::v5::char8_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&,fmt::v5::char8_t>>
                            (pcVar10,end,
                             (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
                              *)&local_30);
      }
      pcVar11 = pcVar10;
      if ((pcVar10 == end) || (pcVar11 = pcVar10 + 1, local_38 = pcVar11, *pcVar10 != 0x7d)) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"invalid format string");
        return pcVar11;
      }
    }
    if ((handler->arg_type_ - named_arg_type < 7) || (handler->arg_type_ == pointer_type)) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"precision not allowed for this argument type");
    }
  }
  if ((local_38 != end) && (cVar5 = *local_38, cVar5 != 0x7d)) {
    local_38 = local_38 + 1;
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
      ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).type = cVar5;
  }
  return local_38;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}